

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void greatest_usage(char *name)

{
  fprintf(_stdout,
          "Usage: %s [-hlfv] [-s SUITE] [-t TEST]\n  -h, --help  print this Help\n  -l          List suites and their tests, then exit\n  -f          Stop runner after first failure\n  -v          Verbose output\n  -s SUITE    only run suites containing string SUITE\n  -t TEST     only run tests containing string TEST\n"
          ,name);
  return;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}